

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv__fs_statfs(uv_fs_t *req)

{
  int iVar1;
  int *piVar2;
  undefined1 local_98 [8];
  statfs buf;
  uv_statfs_t *stat_fs;
  uv_fs_t *req_local;
  
  iVar1 = statfs64(req->path,(statfs64 *)local_98);
  if (iVar1 == 0) {
    buf.f_spare[3] = (__fsword_t)uv__malloc(0x58);
    if ((long *)buf.f_spare[3] == (long *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      req_local._4_4_ = -1;
    }
    else {
      *(undefined1 (*) [8])buf.f_spare[3] = local_98;
      *(__fsword_t *)(buf.f_spare[3] + 8) = buf.f_type;
      *(__fsword_t *)(buf.f_spare[3] + 0x10) = buf.f_bsize;
      *(__fsblkcnt64_t *)(buf.f_spare[3] + 0x18) = buf.f_blocks;
      *(__fsblkcnt64_t *)(buf.f_spare[3] + 0x20) = buf.f_bfree;
      *(__fsblkcnt64_t *)(buf.f_spare[3] + 0x28) = buf.f_bavail;
      *(__fsfilcnt64_t *)(buf.f_spare[3] + 0x30) = buf.f_files;
      req->ptr = (void *)buf.f_spare[3];
      req_local._4_4_ = 0;
    }
  }
  else {
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

static int uv__fs_statfs(uv_fs_t* req) {
  uv_statfs_t* stat_fs;
#if defined(__sun)      || \
    defined(__MVS__)    || \
    defined(__NetBSD__) || \
    defined(__HAIKU__)  || \
    defined(__QNX__)
  struct statvfs buf;

  if (0 != statvfs(req->path, &buf))
#else
  struct statfs buf;

  if (0 != statfs(req->path, &buf))
#endif /* defined(__sun) */
    return -1;

  stat_fs = uv__malloc(sizeof(*stat_fs));
  if (stat_fs == NULL) {
    errno = ENOMEM;
    return -1;
  }

#if defined(__sun)        || \
    defined(__MVS__)      || \
    defined(__OpenBSD__)  || \
    defined(__NetBSD__)   || \
    defined(__HAIKU__)    || \
    defined(__QNX__)
  stat_fs->f_type = 0;  /* f_type is not supported. */
#else
  stat_fs->f_type = buf.f_type;
#endif
  stat_fs->f_bsize = buf.f_bsize;
  stat_fs->f_blocks = buf.f_blocks;
  stat_fs->f_bfree = buf.f_bfree;
  stat_fs->f_bavail = buf.f_bavail;
  stat_fs->f_files = buf.f_files;
  stat_fs->f_ffree = buf.f_ffree;
  req->ptr = stat_fs;
  return 0;
}